

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

VariableP<tcu::Matrix<float,_2,_3>_> __thiscall
vkt::shaderexecutor::variable<tcu::Matrix<float,2,3>>(shaderexecutor *this,string *name)

{
  pointer pcVar1;
  Variable<tcu::Matrix<float,_2,_3>_> *ptr;
  SharedPtrStateBase *extraout_RDX;
  VariableP<tcu::Matrix<float,_2,_3>_> VVar2;
  
  ptr = (Variable<tcu::Matrix<float,_2,_3>_> *)operator_new(0x28);
  (ptr->super_Expr<tcu::Matrix<float,_2,_3>_>).super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Variable_00d3c3e8;
  (ptr->m_name)._M_dataplus._M_p = (pointer)&(ptr->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ptr->m_name,pcVar1,pcVar1 + name->_M_string_length);
  VariableP<tcu::Matrix<float,_2,_3>_>::VariableP((VariableP<tcu::Matrix<float,_2,_3>_> *)this,ptr);
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
       extraout_RDX;
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
       (Variable<tcu::Matrix<float,_2,_3>_> *)this;
  return (VariableP<tcu::Matrix<float,_2,_3>_>)
         VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}